

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_20::NameGenerator::VisitImport(NameGenerator *this,Import *import)

{
  ExternalKind EVar1;
  FuncImport *pFVar2;
  TableImport *pTVar3;
  MemoryImport *pMVar4;
  GlobalImport *pGVar5;
  char *name_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string new_name;
  EventImport *event_import;
  GlobalImport *global_import;
  MemoryImport *memory_import;
  TableImport *table_import;
  FuncImport *func_import;
  string *psStack_30;
  Index index;
  string *name;
  BindingHash *bindings;
  Import *import_local;
  NameGenerator *this_local;
  
  name = (string *)0x0;
  psStack_30 = (string *)0x0;
  func_import._4_4_ = 0xffffffff;
  EVar1 = Import::kind(import);
  switch(EVar1) {
  case First:
    pFVar2 = cast<wabt::FuncImport,wabt::Import>(import);
    if (pFVar2 != (FuncImport *)0x0) {
      name = (string *)&this->module_->func_bindings;
      psStack_30 = &(pFVar2->func).name;
      func_import._4_4_ = this->num_func_imports_;
      this->num_func_imports_ = func_import._4_4_ + 1;
    }
    break;
  case Table:
    pTVar3 = cast<wabt::TableImport,wabt::Import>(import);
    if (pTVar3 != (TableImport *)0x0) {
      name = (string *)&this->module_->table_bindings;
      psStack_30 = &(pTVar3->table).name;
      func_import._4_4_ = this->num_table_imports_;
      this->num_table_imports_ = func_import._4_4_ + 1;
    }
    break;
  case Memory:
    pMVar4 = cast<wabt::MemoryImport,wabt::Import>(import);
    if (pMVar4 != (MemoryImport *)0x0) {
      name = (string *)&this->module_->memory_bindings;
      psStack_30 = &(pMVar4->memory).name;
      func_import._4_4_ = this->num_memory_imports_;
      this->num_memory_imports_ = func_import._4_4_ + 1;
    }
    break;
  case Global:
    pGVar5 = cast<wabt::GlobalImport,wabt::Import>(import);
    if (pGVar5 != (GlobalImport *)0x0) {
      name = (string *)&this->module_->global_bindings;
      psStack_30 = &(pGVar5->global).name;
      func_import._4_4_ = this->num_global_imports_;
      this->num_global_imports_ = func_import._4_4_ + 1;
    }
    break;
  case Event:
    new_name.field_2._8_8_ = cast<wabt::EventImport,wabt::Import>(import);
    if ((EventImport *)new_name.field_2._8_8_ != (EventImport *)0x0) {
      name = (string *)&this->module_->event_bindings;
      psStack_30 = &(((EventImport *)new_name.field_2._8_8_)->event).name;
      func_import._4_4_ = this->num_event_imports_;
      this->num_event_imports_ = func_import._4_4_ + 1;
    }
  }
  if ((name != (string *)0x0) && (psStack_30 != (string *)0x0)) {
    if (func_import._4_4_ == 0xffffffff) {
      __assert_fail("index != kInvalidIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/generate-names.cc"
                    ,0x14a,
                    "Result wabt::(anonymous namespace)::NameGenerator::VisitImport(Import *)");
    }
    std::operator+(&local_a0,&import->module_name,'.');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   &local_a0,&import->field_name);
    std::__cxx11::string::~string((string *)&local_a0);
    name_00 = (char *)std::__cxx11::string::c_str();
    MaybeUseAndBindName(this,(BindingHash *)name,name_00,func_import._4_4_,psStack_30);
    std::__cxx11::string::~string((string *)local_80);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameGenerator::VisitImport(Import* import) {
  BindingHash* bindings = nullptr;
  std::string* name = nullptr;
  Index index = kInvalidIndex;

  switch (import->kind()) {
    case ExternalKind::Func:
      if (auto* func_import = cast<FuncImport>(import)) {
        bindings = &module_->func_bindings;
        name = &func_import->func.name;
        index = num_func_imports_++;
      }
      break;

    case ExternalKind::Table:
      if (auto* table_import = cast<TableImport>(import)) {
        bindings = &module_->table_bindings;
        name = &table_import->table.name;
        index = num_table_imports_++;
      }
      break;

    case ExternalKind::Memory:
      if (auto* memory_import = cast<MemoryImport>(import)) {
        bindings = &module_->memory_bindings;
        name = &memory_import->memory.name;
        index = num_memory_imports_++;
      }
      break;

    case ExternalKind::Global:
      if (auto* global_import = cast<GlobalImport>(import)) {
        bindings = &module_->global_bindings;
        name = &global_import->global.name;
        index = num_global_imports_++;
      }
      break;

    case ExternalKind::Event:
      if (auto* event_import = cast<EventImport>(import)) {
        bindings = &module_->event_bindings;
        name = &event_import->event.name;
        index = num_event_imports_++;
      }
      break;
  }

  if (bindings && name) {
    assert(index != kInvalidIndex);
    std::string new_name = import->module_name + '.' + import->field_name;
    MaybeUseAndBindName(bindings, new_name.c_str(), index, name);
  }

  return Result::Ok;
}